

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x01'>::basic_dynamic_counter
          (basic_dynamic_counter<long,_(unsigned_char)__x01_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
          *labels_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  allocator_type local_89;
  string local_88;
  string local_68;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  local_48;
  
  local_68._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (help->_M_dataplus)._M_p;
  paVar1 = &help->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&help->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_88._M_string_length = help->_M_string_length;
  (help->_M_dataplus)._M_p = (pointer)paVar1;
  help->_M_string_length = 0;
  (help->field_2)._M_local_buf[0] = '\0';
  paVar2 = &local_48._M_elems[0].field_2;
  local_48._M_elems[0]._M_dataplus._M_p = labels_name->_M_elems[0]._M_dataplus._M_p;
  paVar1 = &labels_name->_M_elems[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_elems[0]._M_dataplus._M_p == paVar1) {
    local_48._M_elems[0].field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48._M_elems[0].field_2._8_8_ =
         *(undefined8 *)((long)&labels_name->_M_elems[0].field_2 + 8);
    local_48._M_elems[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_48._M_elems[0].field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_elems[0]._M_string_length = labels_name->_M_elems[0]._M_string_length;
  labels_name->_M_elems[0]._M_dataplus._M_p = (pointer)paVar1;
  labels_name->_M_elems[0]._M_string_length = 0;
  labels_name->_M_elems[0].field_2._M_local_buf[0] = '\0';
  metric_t::metric_t<1ul>((metric_t *)this,Counter,&local_68,&local_88,&local_48);
  (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>).super_dynamic_metric.
  super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_00200dc0;
  uVar4 = std::thread::hardware_concurrency();
  uVar3 = 0x80;
  if (uVar4 < 0x80) {
    uVar3 = uVar4;
  }
  std::
  vector<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::value_type>_>_>_>,_std::allocator<ylt::util::internal::map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x01'>::value_type>_>_>_>_>_>
  ::vector(&(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>).map_.shards_
           ,(ulong)uVar3,&local_89);
  (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>).map_.size_.
  super___atomic_base<long>._M_i = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_elems[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_elems[0]._M_dataplus._M_p,
                    local_48._M_elems[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>).super_dynamic_metric.
  super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_00200d28;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}